

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.cxx
# Opt level: O2

void __thiscall cmFLTKWrapUICommand::FinalPass(cmFLTKWrapUICommand *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  __type _Var3;
  cmTarget *this_00;
  string *psVar4;
  string *__rhs;
  mapped_type *this_01;
  uint uVar5;
  size_t classNum;
  long lVar6;
  string msg;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcs;
  allocator local_69;
  string local_68;
  _Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_48;
  
  this_00 = cmMakefile::FindTarget((this->super_cmCommand).Makefile,&this->Target,false);
  if (this_00 == (cmTarget *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_68,"FLTK_WRAP_UI was called with a target that was never created: ",
               (allocator *)&local_48);
    std::__cxx11::string::append((string *)&local_68);
    std::__cxx11::string::append((char *)&local_68);
    cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::append((char *)&local_68);
    std::__cxx11::string::append((char *)&local_68);
    cmSystemTools::Message(local_68._M_dataplus._M_p,"Warning");
    std::__cxx11::string::~string((string *)&local_68);
    return;
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_68,"",&local_69);
  cmTarget::GetSourceFiles
            (this_00,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_48,&local_68)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  uVar5 = 0;
  while ((ulong)uVar5 <
         (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3)) {
    psVar4 = cmSourceFile::GetFullPath
                       (local_48._M_impl.super__Vector_impl_data._M_start[uVar5],(string *)0x0);
    __rhs = cmSourceFile::GetFullPath
                      (*(this->GeneratedSourcesClasses).
                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                        super__Vector_impl_data._M_start,(string *)0x0);
    _Var3 = std::operator==(psVar4,__rhs);
    uVar5 = uVar5 + 1;
    if (_Var3) goto LAB_003deb3e;
  }
  std::__cxx11::string::string
            ((string *)&local_68,
             "In CMake 2.2 the FLTK_WRAP_UI command sets a variable to the list of source files that should be added to your executable or library. It appears that you have not added these source files to your target. You should change your CMakeLists.txt file to directly add the generated files to the target. For example FTLK_WRAP_UI(foo src1 src2 src3) will create a variable named foo_FLTK_UI_SRCS that contains the list of sources to add to your target when you call ADD_LIBRARY or ADD_EXECUTABLE. For now CMake will add the sources to your target for you as was done in CMake 2.0 and earlier. In the future this may become an error."
             ,&local_69);
  std::__cxx11::string::append((char *)&local_68);
  cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
  std::__cxx11::string::append((char *)&local_68);
  cmSystemTools::Message(local_68._M_dataplus._M_p,"Warning");
  ppcVar1 = (this->GeneratedSourcesClasses).
            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppcVar2 = (this->GeneratedSourcesClasses).
            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar6 = 0; (long)ppcVar1 - (long)ppcVar2 >> 3 != lVar6; lVar6 = lVar6 + 1) {
    this_01 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&((this->super_cmCommand).Makefile)->Targets,&this->Target);
    psVar4 = cmSourceFile::GetFullPath
                       ((this->GeneratedSourcesClasses).
                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar6],(string *)0x0);
    cmTarget::AddSource(this_01,psVar4);
  }
  std::__cxx11::string::~string((string *)&local_68);
LAB_003deb3e:
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void cmFLTKWrapUICommand::FinalPass()
{
  // people should add the srcs to the target themselves, but the old command
  // didn't support that, so check and see if they added the files in and if
  // they didn;t then print a warning and add then anyhow
  cmTarget* target = this->Makefile->FindTarget(this->Target);
  if(!target)
    {
    std::string msg =
      "FLTK_WRAP_UI was called with a target that was never created: ";
    msg += this->Target;
    msg +=".  The problem was found while processing the source directory: ";
    msg += this->Makefile->GetCurrentSourceDirectory();
    msg += ".  This FLTK_WRAP_UI call will be ignored.";
    cmSystemTools::Message(msg.c_str(),"Warning");
    return;
    }
  std::vector<cmSourceFile*> srcs;
  target->GetSourceFiles(srcs, "");
  bool found = false;
  for (unsigned int i = 0; i < srcs.size(); ++i)
    {
    if (srcs[i]->GetFullPath() ==
        this->GeneratedSourcesClasses[0]->GetFullPath())
      {
      found = true;
      break;
      }
    }
  if (!found)
    {
    std::string msg =
      "In CMake 2.2 the FLTK_WRAP_UI command sets a variable to the list of "
      "source files that should be added to your executable or library. It "
      "appears that you have not added these source files to your target. "
      "You should change your CMakeLists.txt file to "
      "directly add the generated files to the target. "
      "For example FTLK_WRAP_UI(foo src1 src2 src3) "
      "will create a variable named foo_FLTK_UI_SRCS that contains the list "
      "of sources to add to your target when you call ADD_LIBRARY or "
      "ADD_EXECUTABLE. For now CMake will add the sources to your target "
      "for you as was done in CMake 2.0 and earlier. In the future this may "
      "become an error.";
    msg +="The problem was found while processing the source directory: ";
    msg += this->Makefile->GetCurrentSourceDirectory();
    cmSystemTools::Message(msg.c_str(),"Warning");
    // first we add the rules for all the .fl to .h and .cxx files
    size_t lastHeadersClass = this->GeneratedSourcesClasses.size();

    // Generate code for all the .fl files
    for(size_t classNum = 0; classNum < lastHeadersClass; classNum++)
      {
      this->Makefile->GetTargets()[this->Target]
        .AddSource(this->GeneratedSourcesClasses[classNum]->GetFullPath());
      }
    }
}